

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printHelp(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_ab59);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printHelp()
{
    std::cout << "usage: cif2xyz cif_file [options]\n"
                 "  options:\n"
                 "    -h : (--help) print this help message and exit\n"
                 "    -v : (--version) print the clTEM command line version number and exit\n"
                 "    -z : (--zone) REQUIRED comma separated list for the crystal zone axis\n"
                 "    -d : (--dimensions) REQUIRED the size of the supercell in Ångströms\n"
                 "    -o : (--output) the output file name\n"
                 "    -n : (--normal) comma separated list for the axis to be aligned with the x direction\n"
                 "    -t : (--tilt) comma separated list for tilts about the x,y,z axes in degrees\n"
                 "    -f : (--fix) attempt to resolve common mistakes in the .cif file\n"
                 "    --verbose : show full output" << std::endl;
}